

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O2

void ShoveChatStr(char *str,BYTE who)

{
  DObject **obj;
  DObject **obj_00;
  DObject *this;
  int iVar1;
  long lVar2;
  char *pcVar3;
  ABasicArmor *pAVar4;
  PClass *pPVar5;
  AAmmo *pAVar6;
  int *piVar7;
  ulong uVar8;
  char *__s;
  char *fmt;
  long lVar9;
  char *local_68;
  FString substBuff;
  
  if (str == (char *)0x0) {
    return;
  }
  if (*str == '\0') {
    return;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  substBuff.Chars = FString::NullString.Nothing;
  local_68 = str;
  if (((*str == '/') && ((byte)(str[1] | 0x20U) == 0x6d)) && ((byte)(str[2] | 0x20U) == 0x65)) {
    local_68 = str + 3;
    who = who | 2;
  }
  Net_WriteByte('\f');
  Net_WriteByte(who);
  if (chat_substitution.Value == true) {
    lVar2 = (long)consoleplayer;
    this = *(DObject **)(&DAT_009ba4f0 + lVar2 * 0x2a0);
    FString::operator=(&substBuff,(char *)"");
    obj = &this[0x22].ObjNext;
    obj_00 = &this[0x22].GCNext;
    __s = local_68;
LAB_0042f898:
    pcVar3 = strchr(__s,0x24);
    if (pcVar3 != (char *)0x0) {
      FString::AppendCStrPart(&substBuff,__s,(long)pcVar3 - (long)__s);
      pcVar3 = pcVar3 + 1;
      lVar9 = 1;
      __s = pcVar3;
      while ((*__s != '\0' && (iVar1 = isalpha((int)*__s), iVar1 != 0))) {
        lVar9 = lVar9 + 1;
        __s = __s + 1;
      }
      switch(lVar9 - 1U) {
      case 0:
        FString::operator+=(&substBuff,'$');
        __s = __s + (*__s == '$');
        goto LAB_0042f898;
      default:
        FString::operator+=(&substBuff,'$');
        FString::AppendCStrPart(&substBuff,pcVar3,lVar9 - 1U);
        goto LAB_0042f898;
      case 4:
        iVar1 = strncasecmp(pcVar3,"ammo",4);
        if (iVar1 != 0) goto LAB_0042f898;
        pcVar3 = "no ammo";
        if (this != (DObject *)0x0) {
          pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj);
          pcVar3 = "no ammo";
          if (pAVar6 != (AAmmo *)0x0) {
            pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj);
            pPVar5 = DObject::GetClass((DObject *)pAVar6);
            FString::AppendFormat
                      (&substBuff,"%s",
                       FName::NameData.NameArray
                       [(pPVar5->super_PStruct).super_PNamedType.TypeName.Index].Text);
            pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj_00);
            if (pAVar6 != (AAmmo *)0x0) {
              pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj_00);
              pPVar5 = DObject::GetClass((DObject *)pAVar6);
              FString::AppendFormat
                        (&substBuff,"/%s",
                         FName::NameData.NameArray
                         [(pPVar5->super_PStruct).super_PNamedType.TypeName.Index].Text);
            }
            goto LAB_0042f898;
          }
        }
        break;
      case 5:
        iVar1 = strncasecmp(pcVar3,"armor",5);
        if (iVar1 == 0) {
          pAVar4 = AActor::FindInventory<ABasicArmor>((AActor *)(&players)[lVar2 * 0x54]);
          if (pAVar4 != (ABasicArmor *)0x0) {
            piVar7 = &(pAVar4->super_AArmor).super_AInventory.Amount;
            fmt = "%d";
            goto LAB_0042fb5c;
          }
          uVar8 = 0;
          fmt = "%d";
          goto LAB_0042fb5e;
        }
        goto LAB_0042f898;
      case 6:
        iVar1 = strncasecmp(pcVar3,"health",6);
        fmt = "%d";
        piVar7 = &DAT_009ba4b8 + lVar2 * 0xa8;
        if (iVar1 == 0) goto LAB_0042fb5c;
        iVar1 = strncasecmp(pcVar3,"weapon",6);
        if (iVar1 != 0) goto LAB_0042f898;
        pcVar3 = "no weapon";
        if (this != (DObject *)0x0) {
          pPVar5 = DObject::GetClass(this);
          FString::operator+=(&substBuff,&(pPVar5->super_PStruct).super_PNamedType.TypeName);
          goto LAB_0042f898;
        }
        break;
      case 9:
        goto switchD_0042f8f1_caseD_9;
      }
      FString::operator+=(&substBuff,pcVar3);
      goto LAB_0042f898;
    }
    if (__s != local_68) {
      FString::operator+=(&substBuff,__s);
      Net_WriteString(substBuff.Chars);
      goto LAB_0042fb95;
    }
  }
  Net_WriteString(local_68);
LAB_0042fb95:
  FString::~FString(&substBuff);
  return;
switchD_0042f8f1_caseD_9:
  iVar1 = strncasecmp(pcVar3,"ammocount",9);
  if (iVar1 == 0) {
    if (this == (DObject *)0x0) {
      FString::operator+=(&substBuff,'0');
    }
    else {
      pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj);
      if (pAVar6 == (AAmmo *)0x0) {
        uVar8 = 0;
      }
      else {
        pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj);
        uVar8 = (ulong)(uint)(pAVar6->super_AInventory).Amount;
      }
      FString::AppendFormat(&substBuff,"%d",uVar8);
      pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj_00);
      if (pAVar6 != (AAmmo *)0x0) {
        pAVar6 = GC::ReadBarrier<AAmmo>((AAmmo **)obj_00);
        fmt = "/%d";
        piVar7 = &(pAVar6->super_AInventory).Amount;
LAB_0042fb5c:
        uVar8 = (ulong)(uint)*piVar7;
LAB_0042fb5e:
        FString::AppendFormat(&substBuff,fmt,uVar8);
      }
    }
  }
  goto LAB_0042f898;
}

Assistant:

static void ShoveChatStr (const char *str, BYTE who)
{
	// Don't send empty messages
	if (str == NULL || str[0] == '\0')
		return;

	FString substBuff;

	if (str[0] == '/' &&
		(str[1] == 'm' || str[1] == 'M') &&
		(str[2] == 'e' || str[2] == 'E'))
	{ // This is a /me message
		str += 3;
		who |= 2;
	}

	Net_WriteByte (DEM_SAY);
	Net_WriteByte (who);

	if (!chat_substitution || !DoSubstitution (substBuff, str))
	{
		Net_WriteString (str);
	}
	else
	{
		Net_WriteString (substBuff);
	}
}